

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O0

void Hex::Hexdumper<unsigned_short>::output_hex
               (ostream *os,unsigned_short *first,unsigned_short *last,char filler,int numberbase,
               bool showbase,bool uppercasehex)

{
  remove_const_t<unsigned_short> val_00;
  _Setfill<char> _Var1;
  bool bVar2;
  _Setw _Var3;
  unsigned_short *puStack_38;
  unsigned_short val;
  unsigned_short *p;
  bool uppercasehex_local;
  bool showbase_local;
  int numberbase_local;
  char filler_local;
  unsigned_short *last_local;
  unsigned_short *first_local;
  ostream *os_local;
  
  for (puStack_38 = first; puStack_38 < last; puStack_38 = puStack_38 + 1) {
    if ((filler != '\0') && (first < puStack_38)) {
      std::operator<<(os,filler);
    }
    val_00 = *puStack_38;
    _Var1 = std::setfill<char>('0');
    std::operator<<(os,_Var1._M_c);
    if (showbase) {
      std::ostream::operator<<(os,std::showbase);
    }
    if (uppercasehex) {
      std::ostream::operator<<(os,std::uppercase);
    }
    if (numberbase == 8) {
      _Var3 = std::setw(4);
      std::operator<<(os,_Var3);
      std::ostream::operator<<(os,std::hex);
    }
    else if (numberbase == 0x40) {
      _Var3 = std::setw(6);
      std::operator<<(os,_Var3);
      std::ostream::operator<<(os,std::oct);
    }
    else if (numberbase == 2) {
      _Var3 = std::setw(4);
      std::operator<<(os,_Var3);
      std::ostream::operator<<(os,std::dec);
    }
    bVar2 = Hexdumper_base::getbin(os);
    if (bVar2) {
      if (showbase) {
        std::operator<<(os,"0b");
      }
      _Var3 = std::setw(0x10);
      std::operator<<(os,_Var3);
      output_bin(os,val_00);
    }
    else {
      output_hex_int<unsigned_short>(os,val_00);
    }
  }
  return;
}

Assistant:

static void output_hex(std::ostream& os, const T*first, const T*last, char filler, int numberbase, bool showbase, bool uppercasehex)
    {
        const T* p = first;
        while (p < last)
        {
            if (filler && p > first)
                os << filler;
            auto val = *p;
            os << std::setfill('0');
            if (showbase)
                os << std::showbase;
            if (uppercasehex)
                os << std::uppercase;

            if (numberbase==os.hex) {
                os << std::setw(sizeof(T)*2);
                os << std::hex;
            }
            else if (numberbase==os.oct) {
                os << std::setw((sizeof(T)*8+2)/3);
                os << std::oct;
            }
            else if (numberbase==os.dec) {
                os << std::setw(sizeof(T)*2);
                os << std::dec;
            }

            if (getbin(os)) {
                if (showbase)
                    os << "0b";
                os << std::setw(sizeof(T)*8);
                output_bin(os, val);
            }
            else {
                output_hex_int(os, val);
            }

            ++p;
        }
    }